

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O3

Bool prvTidyIsAnchorElement(TidyDocImpl *doc,Node *node)

{
  uint uVar1;
  
  if ((((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) &&
      (uVar1 = node->tag->id - TidyTag_A, uVar1 < 0x40)) &&
     ((0x800a003000000021U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
    return yes;
  }
  return no;
}

Assistant:

Bool TY_(IsAnchorElement)( TidyDocImpl* ARG_UNUSED(doc), Node* node)
{
    TidyTagId tid = TagId( node );
    if ( tid == TidyTag_A      ||
         tid == TidyTag_APPLET ||
         tid == TidyTag_FORM   ||
         tid == TidyTag_FRAME  ||
         tid == TidyTag_IFRAME ||
         tid == TidyTag_IMG    ||
         tid == TidyTag_MAP )
        return yes;

    return no;
}